

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void alist_clone(t_alist *x,t_alist *y,int onset,int count)

{
  undefined4 uVar1;
  t_listelem *ptVar2;
  t_listelem *ptVar3;
  int local_24;
  int i;
  int count_local;
  int onset_local;
  t_alist *y_local;
  t_alist *x_local;
  
  y->l_pd = alist_class;
  y->l_n = count;
  y->l_npointer = 0;
  ptVar2 = (t_listelem *)getbytes((long)y->l_n * 0x28);
  y->l_vec = ptVar2;
  if (ptVar2 == (t_listelem *)0x0) {
    y->l_n = 0;
    pd_error((void *)0x0,"list_alloc: out of memory");
  }
  else {
    for (local_24 = 0; local_24 < count; local_24 = local_24 + 1) {
      ptVar2 = y->l_vec + local_24;
      ptVar3 = x->l_vec + (onset + local_24);
      uVar1 = *(undefined4 *)&(ptVar3->l_a).field_0x4;
      (ptVar2->l_a).a_type = (ptVar3->l_a).a_type;
      *(undefined4 *)&(ptVar2->l_a).field_0x4 = uVar1;
      (ptVar2->l_a).a_w = (ptVar3->l_a).a_w;
      if (y->l_vec[local_24].l_a.a_type == A_POINTER) {
        gpointer_copy(y->l_vec[local_24].l_a.a_w.w_gpointer,&y->l_vec[local_24].l_p);
        y->l_vec[local_24].l_a.a_w.w_symbol = (t_symbol *)&y->l_vec[local_24].l_p;
        y->l_npointer = y->l_npointer + 1;
      }
    }
  }
  return;
}

Assistant:

static void alist_clone(t_alist *x, t_alist *y, int onset, int count)
{
    int i;
    y->l_pd = alist_class;
    y->l_n = count;
    y->l_npointer = 0;
    if (!(y->l_vec = (t_listelem *)getbytes(y->l_n * sizeof(*y->l_vec))))
    {
        y->l_n = 0;
        pd_error(0, "list_alloc: out of memory");
    }
    else for (i = 0; i < count; i++)
    {
        y->l_vec[i].l_a = x->l_vec[onset + i].l_a;
        if (y->l_vec[i].l_a.a_type == A_POINTER)
        {
            gpointer_copy(y->l_vec[i].l_a.a_w.w_gpointer, &y->l_vec[i].l_p);
            y->l_vec[i].l_a.a_w.w_gpointer = &y->l_vec[i].l_p;
            y->l_npointer++;
        }
    }
}